

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::do_socket(Server *this)

{
  int iVar1;
  char *pcVar2;
  int enable;
  
  enable = 1;
  iVar1 = socket(2,0x801,0);
  this->server_sock = iVar1;
  if (iVar1 < 0) {
    fprintf(_stderr,"%s:%d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
            0x32);
    pcVar2 = "this->server_sock";
  }
  else {
    iVar1 = setsockopt(iVar1,1,2,&enable,4);
    if (iVar1 < 0) {
      fprintf(_stderr,"%s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
              0x33);
      pcVar2 = "setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int))";
    }
    else {
      iVar1 = setsockopt(this->server_sock,1,0xf,&enable,4);
      if (-1 < iVar1) {
        return;
      }
      fprintf(_stderr,"%s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Fugoes[P]Webe/src/server.cpp",
              0x34);
      pcVar2 = "setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEPORT, &enable, sizeof(int))";
    }
  }
  fprintf(_stderr,"--> %s\n",pcVar2);
  perror("info");
  exit(1);
}

Assistant:

void Server::do_socket() {
    int enable = 1;
    this->server_sock = socket(AF_INET, SOCK_STREAM | SOCK_NONBLOCK, 0);
    IF_NEGATIVE_EXIT(this->server_sock);
    IF_NEGATIVE_EXIT(setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEADDR, &enable, sizeof(int)));
    IF_NEGATIVE_EXIT(setsockopt(this->server_sock, SOL_SOCKET, SO_REUSEPORT, &enable, sizeof(int)));
}